

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

Curl_addrinfo * Curl_resolver_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  Curl_easy *data;
  time_t *ptVar1;
  _Bool _Var2;
  int iVar3;
  Curl_addrinfo *pCVar4;
  undefined8 *puVar5;
  pthread_mutex_t *__mutex;
  char *pcVar6;
  pthread_t *ppVar7;
  int *piVar8;
  undefined4 uVar9;
  Curl_async *async;
  curltime cVar10;
  char sbuf [12];
  undefined4 local_4c;
  char local_40 [16];
  
  data = conn->data;
  ptVar1 = (time_t *)(data->state).resolver;
  *waitp = 0;
  iVar3 = inet_pton(2,hostname,local_40);
  if (0 < iVar3) {
    iVar3 = 2;
LAB_00138390:
    pCVar4 = Curl_ip2addr(iVar3,local_40,hostname,port);
    return pCVar4;
  }
  uVar9 = 10;
  iVar3 = inet_pton(10,hostname,local_40);
  if (0 < iVar3) {
    iVar3 = 10;
    goto LAB_00138390;
  }
  if (conn->ip_version == 1) {
    local_4c = 2;
  }
  else {
    if (conn->ip_version != 2) {
      uVar9 = 0;
    }
    _Var2 = Curl_ipv6works();
    local_4c = 2;
    if (_Var2) {
      local_4c = uVar9;
    }
  }
  iVar3 = conn->socktype;
  curl_msnprintf(local_40,0xc,"%d",(ulong)(uint)port);
  cVar10 = Curl_now();
  *ptVar1 = cVar10.tv_sec;
  *(int *)(ptVar1 + 1) = cVar10.tv_usec;
  puVar5 = (undefined8 *)(*Curl_ccalloc)(1,0x78);
  (conn->async).os_specific = puVar5;
  if (puVar5 != (undefined8 *)0x0) {
    (conn->async).port = port;
    (conn->async).done = false;
    (conn->async).status = 0;
    (conn->async).dns = (Curl_dns_entry *)0x0;
    *puVar5 = 0;
    puVar5[5] = 0;
    puVar5[6] = 0;
    puVar5[3] = 0;
    puVar5[4] = 0;
    puVar5[7] = 0;
    puVar5[0xe] = puVar5;
    *(int *)(puVar5 + 6) = port;
    *(undefined4 *)(puVar5 + 4) = 1;
    *(undefined4 *)(puVar5 + 8) = 0;
    *(undefined4 *)((long)puVar5 + 0x44) = local_4c;
    *(int *)(puVar5 + 9) = iVar3;
    *(undefined8 *)((long)puVar5 + 0x4c) = 0;
    *(undefined8 *)((long)puVar5 + 0x54) = 0;
    *(undefined8 *)((long)puVar5 + 0x5c) = 0;
    *(undefined8 *)((long)puVar5 + 100) = 0;
    *(undefined4 *)((long)puVar5 + 0x6c) = 0;
    __mutex = (pthread_mutex_t *)(*Curl_cmalloc)(0x28);
    puVar5[3] = __mutex;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      *(undefined4 *)((long)puVar5 + 0x34) = 0;
      pcVar6 = (*Curl_cstrdup)(hostname);
      puVar5[5] = pcVar6;
      if (pcVar6 != (char *)0x0) {
        async = &conn->async;
        (*Curl_cfree)(async->hostname);
        pcVar6 = (*Curl_cstrdup)(hostname);
        async->hostname = pcVar6;
        if (pcVar6 == (char *)0x0) {
          iVar3 = 0xc;
        }
        else {
          *(undefined4 *)(puVar5 + 4) = 0;
          ppVar7 = Curl_thread_create(getaddrinfo_thread,(thread_sync_data *)(puVar5 + 3));
          *puVar5 = ppVar7;
          if (ppVar7 != (pthread_t *)0x0) {
            *waitp = 1;
            return (Curl_addrinfo *)0x0;
          }
          *(undefined4 *)(puVar5 + 4) = 1;
          piVar8 = __errno_location();
          iVar3 = *piVar8;
        }
        destroy_async_data(async);
        goto LAB_00138552;
      }
    }
    destroy_thread_sync_data((thread_sync_data *)(puVar5 + 3));
    (conn->async).os_specific = (void *)0x0;
    (*Curl_cfree)(puVar5);
  }
  iVar3 = 0xc;
LAB_00138552:
  piVar8 = __errno_location();
  *piVar8 = iVar3;
  Curl_failf(data,"getaddrinfo() thread failed to start\n");
  return (Curl_addrinfo *)0x0;
}

Assistant:

Curl_addrinfo *Curl_resolver_getaddrinfo(struct connectdata *conn,
                                         const char *hostname,
                                         int port,
                                         int *waitp)
{
  struct addrinfo hints;
  char sbuf[12];
  int pf = PF_INET;
  struct Curl_easy *data = conn->data;
  struct resdata *reslv = (struct resdata *)data->state.resolver;

  *waitp = 0; /* default to synchronous response */

#ifndef USE_RESOLVE_ON_IPS
  {
    struct in_addr in;
    /* First check if this is an IPv4 address string */
    if(Curl_inet_pton(AF_INET, hostname, &in) > 0)
      /* This is a dotted IP address 123.123.123.123-style */
      return Curl_ip2addr(AF_INET, &in, hostname, port);
  }
#ifdef CURLRES_IPV6
  {
    struct in6_addr in6;
    /* check if this is an IPv6 address string */
    if(Curl_inet_pton(AF_INET6, hostname, &in6) > 0)
      /* This is an IPv6 address literal */
      return Curl_ip2addr(AF_INET6, &in6, hostname, port);
  }
#endif /* CURLRES_IPV6 */
#endif /* !USE_RESOLVE_ON_IPS */

#ifdef CURLRES_IPV6
  /*
   * Check if a limited name resolve has been requested.
   */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works())
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;
#endif /* CURLRES_IPV6 */

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = conn->socktype;

  msnprintf(sbuf, sizeof(sbuf), "%d", port);

  reslv->start = Curl_now();
  /* fire up a new resolver thread! */
  if(init_resolve_thread(conn, hostname, port, &hints)) {
    *waitp = 1; /* expect asynchronous response */
    return NULL;
  }

  failf(data, "getaddrinfo() thread failed to start\n");
  return NULL;

}